

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.h
# Opt level: O2

void __thiscall
KDIS::PDU::Entity_State_PDU::SetEntityMarking(Entity_State_PDU *this,EntityMarking *EM)

{
  KUINT8 KVar1;
  KCHAR8 KVar2;
  KCHAR8 KVar3;
  KCHAR8 KVar4;
  KCHAR8 KVar5;
  KCHAR8 KVar6;
  KCHAR8 KVar7;
  KCHAR8 KVar8;
  
  KVar1 = EM->m_ui8EntityMarkingCharacterSet;
  KVar2 = EM->m_sEntityMarkingString[0];
  KVar3 = EM->m_sEntityMarkingString[1];
  KVar4 = EM->m_sEntityMarkingString[2];
  KVar5 = EM->m_sEntityMarkingString[3];
  KVar6 = EM->m_sEntityMarkingString[4];
  KVar7 = EM->m_sEntityMarkingString[5];
  KVar8 = EM->m_sEntityMarkingString[6];
  *(undefined8 *)((this->m_EntityMarking).m_sEntityMarkingString + 4) =
       *(undefined8 *)(EM->m_sEntityMarkingString + 4);
  (this->m_EntityMarking).m_ui8EntityMarkingCharacterSet = KVar1;
  (this->m_EntityMarking).m_sEntityMarkingString[0] = KVar2;
  (this->m_EntityMarking).m_sEntityMarkingString[1] = KVar3;
  (this->m_EntityMarking).m_sEntityMarkingString[2] = KVar4;
  (this->m_EntityMarking).m_sEntityMarkingString[3] = KVar5;
  (this->m_EntityMarking).m_sEntityMarkingString[4] = KVar6;
  (this->m_EntityMarking).m_sEntityMarkingString[5] = KVar7;
  (this->m_EntityMarking).m_sEntityMarkingString[6] = KVar8;
  return;
}

Assistant:

class KDIS_EXPORT EntityMarking : public DataTypeBase
{
protected:

    KUINT8 m_ui8EntityMarkingCharacterSet;

    KCHAR8 m_sEntityMarkingString[12]; // Extra octet for terminator, not included in size

public:

    static const KUINT16 ENTITY_MARKING_SIZE = 12;

    EntityMarking();

    EntityMarking(KDataStream &stream) noexcept(false);

    EntityMarking(const KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet MarkingCharSet, const KCHAR8 *MarkingText,
                  KUINT16 TextSize) noexcept(false);

    EntityMarking(const KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet MarkingCharSet,
                  const KString &MarkingText) noexcept(false);

    virtual ~EntityMarking();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityMarking::SetEntityMarkingCharacterSet
    //              KDIS::DATA_TYPE::EntityMarking::GetEntityMarkingCharacterSet
    // Description: Marking Char set
    // Parameter:   EntityMarkingCharacterSet EMCS, void
    //************************************
    void SetEntityMarkingCharacterSet( KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet EMCS );
    KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet GetEntityMarkingCharacterSet() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityMarking::SetEntityMarkingString
    //              KDIS::DATA_TYPE::EntityMarking::GetEntityMarkingString
    // Description: Marking string. entity name etc. max 11 characters.. Throws exception if string is too big.
    // Parameter:   const KCHAR8 * EMS, const KString & EMS
    // Parameter:   KUINT16 StringSize
    //************************************
    void SetEntityMarkingString(const KCHAR8 *EMS, KUINT16 StringSize) noexcept(false);

    void SetEntityMarkingString(const KString &EMS) noexcept(false);
    KString GetEntityMarkingString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityMarking::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityMarking::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityMarking::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const EntityMarking & Value ) const;
    KBOOL operator != ( const EntityMarking & Value ) const;
}